

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  pingpong *pp;
  unsigned_short uVar2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  undefined6 extraout_var;
  int *piVar10;
  long lVar11;
  ftpport fVar12;
  Curl_addrinfo *ai;
  char cVar13;
  size_t sVar14;
  SessionHandle *data;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  curl_socket_t local_9e8;
  ftpport local_9e4;
  SessionHandle *local_9e0;
  socklen_t local_9d4;
  undefined4 local_9d0;
  uint local_9cc;
  pingpong *local_9c8;
  Curl_dns_entry *local_9c0;
  sockaddr local_9b8 [8];
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  data = conn->data;
  local_9e8 = -1;
  memset(local_938,0,0x100);
  pcVar8 = (data->set).str[9];
  local_9c0 = (Curl_dns_entry *)0x0;
  if ((pcVar8 == (char *)0x0) || (sVar5 = strlen(pcVar8), sVar5 < 2)) {
    pcVar6 = (char *)0x0;
    uVar15 = 0;
    uVar17 = 0;
LAB_0011706d:
    local_9d4 = 0x80;
    iVar4 = getsockname(conn->sock[0],local_9b8,&local_9d4);
    if (iVar4 != 0) {
      piVar10 = __errno_location();
      pcVar8 = Curl_strerror(conn,*piVar10);
      pcVar7 = "getsockname() failed: %s";
      goto LAB_001171f8;
    }
    pcVar8 = local_438;
    local_9e4 = fcmd;
    local_9e0 = data;
    Curl_inet_ntop((uint)local_9b8[0].sa_family,local_9b8[0].sa_data + 2,pcVar8,0x401);
    local_9d0 = 0;
  }
  else {
    sVar14 = 0x11;
    if (0xf < sVar5) {
      sVar14 = sVar5 + 1;
    }
    pcVar6 = (char *)(*Curl_ccalloc)(sVar14,1);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar7 = pcVar8;
    local_9e4 = fcmd;
    if (*pcVar8 == ':') {
LAB_00116ff6:
      pcVar8 = strchr(pcVar7,0x3a);
      if (pcVar8 == (char *)0x0) goto LAB_001170f9;
      uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
      uVar2 = curlx_ultous(uVar9);
      uVar17 = (uint)CONCAT62(extraout_var,uVar2);
      pcVar8 = strchr(pcVar8,0x2d);
      uVar16 = uVar17;
      if (pcVar8 != (char *)0x0) {
        uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar9);
        uVar16 = (uint)uVar2;
      }
    }
    else {
      pcVar7 = strchr(pcVar8,0x3a);
      if (pcVar7 != (char *)0x0) {
        strncpy(pcVar6,pcVar8,(long)pcVar7 - (long)pcVar8);
        goto LAB_00116ff6;
      }
      strcpy(pcVar6,pcVar8);
LAB_001170f9:
      uVar17 = 0;
      uVar16 = 0;
    }
    uVar15 = (ushort)uVar16;
    if (uVar15 < (ushort)uVar17) {
      uVar17 = 0;
      uVar15 = 0;
    }
    fcmd = local_9e4;
    if (*pcVar6 == '\0') goto LAB_0011706d;
    local_9e0 = data;
    pcVar7 = Curl_if2ip(conn->ip_addr->ai_family,pcVar6,local_438,0x401);
    pcVar8 = pcVar6;
    if (pcVar7 != (char *)0x0) {
      pcVar8 = local_438;
    }
    local_9d0 = (undefined4)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
  }
  Curl_resolv(conn,pcVar8,0,&local_9c0);
  if (local_9c0 != (Curl_dns_entry *)0x0) {
    ai = local_9c0->addr;
    Curl_resolv_unlock(local_9e0,local_9c0);
    if (ai != (Curl_addrinfo *)0x0) {
      if (pcVar6 != (char *)0x0) {
        (*Curl_cfree)(pcVar6);
      }
      local_9e8 = -1;
      while (CVar3 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&local_9e8), CVar3 != CURLE_OK) {
        ai = ai->ai_next;
        if (ai == (Curl_addrinfo *)0x0) {
          piVar10 = __errno_location();
          pcVar8 = Curl_strerror(conn,*piVar10);
          Curl_failf(local_9e0,"socket failure: %s",pcVar8);
          return CURLE_FTP_PORT_FAILED;
        }
      }
      local_9c8 = (pingpong *)&conn->proto;
      memcpy(local_9b8,ai->ai_addr,(ulong)ai->ai_addrlen);
      local_9d4 = ai->ai_addrlen;
      local_9cc = uVar17;
      if (uVar15 < (ushort)uVar17) {
LAB_00117246:
        Curl_failf(local_9e0,"bind() failed, we ran out of ports!");
      }
      else {
        do {
          while( true ) {
            if (local_9b8[0].sa_family == 2) {
              local_9b8[0].sa_data._0_2_ = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
            }
            iVar4 = bind(local_9e8,local_9b8,local_9d4);
            if (iVar4 == 0) {
              local_9d4 = 0x80;
              iVar4 = getsockname(local_9e8,local_9b8,&local_9d4);
              if (iVar4 != 0) {
                piVar10 = __errno_location();
                iVar4 = *piVar10;
                goto LAB_00117341;
              }
              iVar4 = listen(local_9e8,1);
              if (iVar4 != 0) {
                piVar10 = __errno_location();
                pcVar8 = Curl_strerror(conn,*piVar10);
                pcVar6 = "socket failure: %s";
                goto LAB_0011739f;
              }
              Curl_printable_address(ai,local_938,0x100);
              pp = local_9c8;
              iVar4 = 2;
              if (local_9e4 == DONE) goto LAB_00117428;
              fVar12 = local_9e4;
              goto LAB_00117406;
            }
            piVar10 = __errno_location();
            iVar4 = *piVar10;
            if ((iVar4 == 99 & (byte)local_9d0) == 1) break;
            if ((iVar4 != 0xd) && (iVar4 != 0x62)) {
              pcVar8 = Curl_strerror(conn,iVar4);
              Curl_failf(local_9e0,"bind(port=%hu) failed: %s",(ulong)(uVar17 & 0xffff),pcVar8);
              goto LAB_001173ae;
            }
            uVar17 = uVar17 + 1;
            if (uVar15 < (ushort)uVar17) goto LAB_00117246;
          }
          pcVar8 = Curl_strerror(conn,99);
          local_9d0 = 0;
          Curl_infof(local_9e0,"bind(port=%hu) on non-local address failed: %s\n",
                     (ulong)(uVar17 & 0xffff),pcVar8);
          local_9d4 = 0x80;
          iVar4 = getsockname(conn->sock[0],local_9b8,&local_9d4);
          uVar17 = local_9cc;
        } while (iVar4 == 0);
        iVar4 = *piVar10;
LAB_00117341:
        pcVar8 = Curl_strerror(conn,iVar4);
        pcVar6 = "getsockname() failed: %s";
LAB_0011739f:
        Curl_failf(local_9e0,pcVar6,pcVar8);
      }
LAB_001173ae:
      Curl_closesocket(conn,local_9e8);
      return CURLE_FTP_PORT_FAILED;
    }
  }
  pcVar7 = "failed to resolve the address provided to PORT: %s";
  data = local_9e0;
LAB_001171f8:
  Curl_failf(data,pcVar7,pcVar8);
  if (pcVar6 != (char *)0x0) {
    (*Curl_cfree)(pcVar6);
    return CURLE_FTP_PORT_FAILED;
  }
  return CURLE_FTP_PORT_FAILED;
LAB_00117406:
  if (((fVar12 != EPRT) || ((conn->bits).ftp_use_eprt != false)) && (local_9b8[0].sa_family == 2)) {
    if (fVar12 == EPRT) {
      iVar4 = 0;
      CVar3 = Curl_pp_sendf(local_9c8,"%s |%d|%s|%hu|",ftp_state_use_port::mode,1,local_938,
                            (ulong)(ushort)(local_9b8[0].sa_data._0_2_ << 8 |
                                           (ushort)local_9b8[0].sa_data._0_2_ >> 8));
      if (CVar3 != CURLE_OK) {
        pcVar8 = curl_easy_strerror(CVar3);
        Curl_failf(local_9e0,"Failure sending EPRT command: %s",pcVar8);
        Curl_closesocket(conn,local_9e8);
        (conn->proto).ftpc.count1 = 1;
        goto LAB_0011757c;
      }
      goto LAB_00117428;
    }
    if (fVar12 == PORT) {
      lVar11 = 0;
      while( true ) {
        cVar1 = local_938[lVar11];
        cVar13 = ',';
        if ((cVar1 != '.') && (cVar13 = cVar1, cVar1 == '\0')) break;
        local_838[lVar11] = cVar13;
        lVar11 = lVar11 + 1;
      }
      local_838[lVar11] = '\0';
      curl_msnprintf(local_838 + lVar11,0x14,",%d,%d",(ulong)(local_9b8[0].sa_data._0_2_ & 0xff),
                     (ulong)SUB21(local_9b8[0].sa_data._0_2_,1));
      CVar3 = Curl_pp_sendf(pp,"%s %s",0x13a1f5,local_838);
      if (CVar3 != CURLE_OK) {
        pcVar8 = curl_easy_strerror(CVar3);
        Curl_failf(local_9e0,"Failure sending PORT command: %s",pcVar8);
        Curl_closesocket(conn,local_9e8);
LAB_0011757c:
        (conn->proto).ftpc.state = FTP_STOP;
        return CVar3;
      }
      iVar4 = 1;
LAB_00117428:
      (conn->proto).ftpc.count1 = iVar4;
      if (conn->sock[1] != -1) {
        Curl_closesocket(conn,conn->sock[1]);
      }
      conn->sock[1] = local_9e8;
      (conn->bits).tcpconnect[1] = true;
      (conn->proto).ftpc.state = FTP_PORT;
      return CURLE_OK;
    }
  }
  fVar12 = fVar12 + PORT;
  if (fVar12 == DONE) goto LAB_00117428;
  goto LAB_00117406;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct SessionHandle *data=conn->data;
  curl_socket_t portsock= CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa=(struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h=NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen+1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      if((ip_end = strchr(string_ftpport, ']')) != NULL )
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
    }
    else if((ip_end = strchr(string_ftpport, ':')) != NULL) {
        /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
      if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
        /* ipv6 */
        port_min = port_max = 0;
        strcpy(addr, string_ftpport);
        ip_end = NULL; /* this got no port ! */
      }
      else
#endif
        /* (ipv4|domain|interface):port(-range) */
        strncpy(addr, string_ftpport, ip_end - ip_start );
    }
    else
      /* ipv4|interface */
      strcpy(addr, string_ftpport);

    /* parse the port */
    if(ip_end != NULL) {
      if((port_start = strchr(ip_end, ':')) != NULL) {
        port_min = curlx_ultous(strtoul(port_start+1, NULL, 10));
        if((port_sep = strchr(port_start, '-')) != NULL) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711 , in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max )
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      if(!Curl_if2ip(conn->ip_addr->ai_family, addr,
                     hbuf, sizeof(hbuf)))
        /* not an interface, use the given string as host name instead */
        host = addr;
      else
        host = hbuf; /* use the hbuf for host name */
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      Curl_safefree(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    Curl_safefree(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  Curl_safefree(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      else if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is ipv4 only */
      continue;

    switch (sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    else if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest=',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}